

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

void __thiscall pbrt::syntactic::Loc::Loc(Loc *this,Loc *param_1)

{
  int iVar1;
  
  std::__shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2> *)param_1);
  iVar1 = param_1->col;
  this->line = param_1->line;
  this->col = iVar1;
  return;
}

Assistant:

struct PBRT_PARSER_INTERFACE Loc {
      //! pretty-print
      std::string toString() const {
        return "@" + (file?file->getFileName():"<invalid>") + ":" + std::to_string(line) + "." + std::to_string(col);
      }

      std::shared_ptr<File> file;
      int line;
      int col;
    }